

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine2d.c
# Opt level: O2

void glmc_rotate2d_to(vec3 *m,float angle,vec3 *dest)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float local_58;
  float fStack_54;
  float local_38;
  float fStack_34;
  
  fVar1 = m[1][0];
  fVar2 = (*m)[0];
  uVar3 = *(undefined8 *)(*m + 1);
  uVar4 = *(undefined8 *)(m[1] + 1);
  fVar5 = sinf(angle);
  fVar6 = cosf(angle);
  local_58 = (float)uVar4;
  fStack_54 = (float)((ulong)uVar4 >> 0x20);
  local_38 = (float)uVar3;
  fStack_34 = (float)((ulong)uVar3 >> 0x20);
  (*dest)[0] = fVar6 * fVar2 + fVar5 * fVar1;
  (*dest)[1] = fVar6 * local_38 + fVar5 * local_58;
  (*dest)[2] = fVar6 * fStack_34 + fVar5 * fStack_54;
  dest[1][0] = -fVar5 * fVar2 + fVar6 * fVar1;
  *(ulong *)(dest[1] + 1) =
       CONCAT44(fStack_54 * fVar6 - fVar5 * fStack_34,local_58 * fVar6 - fVar5 * local_38);
  dest[2][0] = m[2][0];
  dest[2][1] = m[2][1];
  dest[2][2] = m[2][2];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate2d_to(mat3 m, float angle, mat3 dest) {
  glm_rotate2d_to(m, angle, dest);
}